

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DataViewDefault.cpp
# Opt level: O0

bool __thiscall
Rml::DataViewCommon::Initialize
          (DataViewCommon *this,DataModel *model,Element *element,String *expression_str,
          String *in_modifier)

{
  bool bVar1;
  ulong uVar2;
  pointer this_00;
  undefined1 local_50 [7];
  bool result;
  DataExpressionInterface expr_interface;
  String *in_modifier_local;
  String *expression_str_local;
  Element *element_local;
  DataModel *model_local;
  DataViewCommon *this_local;
  
  uVar2 = ::std::__cxx11::string::empty();
  if ((uVar2 & 1) != 0) {
    ::std::__cxx11::string::operator=((string *)&this->modifier,(string *)in_modifier);
  }
  MakeUnique<Rml::DataExpression,std::__cxx11::string_const&>
            ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
             &expr_interface.event);
  ::std::unique_ptr<Rml::DataExpression,_std::default_delete<Rml::DataExpression>_>::operator=
            (&this->expression,
             (unique_ptr<Rml::DataExpression,_std::default_delete<Rml::DataExpression>_> *)
             &expr_interface.event);
  ::std::unique_ptr<Rml::DataExpression,_std::default_delete<Rml::DataExpression>_>::~unique_ptr
            ((unique_ptr<Rml::DataExpression,_std::default_delete<Rml::DataExpression>_> *)
             &expr_interface.event);
  DataExpressionInterface::DataExpressionInterface
            ((DataExpressionInterface *)local_50,model,element,(Event *)0x0);
  this_00 = ::std::unique_ptr<Rml::DataExpression,_std::default_delete<Rml::DataExpression>_>::
            operator->(&this->expression);
  bVar1 = DataExpression::Parse(this_00,(DataExpressionInterface *)local_50,false);
  return bVar1;
}

Assistant:

bool DataViewCommon::Initialize(DataModel& model, Element* element, const String& expression_str, const String& in_modifier)
{
	// The modifier can be overriden in the constructor
	if (modifier.empty())
		modifier = in_modifier;

	expression = MakeUnique<DataExpression>(expression_str);
	DataExpressionInterface expr_interface(&model, element);

	bool result = expression->Parse(expr_interface, false);
	return result;
}